

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryRemove(InMemoryDirectory *this,PathPtr path)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Impl *pIVar4;
  String *pSVar5;
  Own<const_kj::Directory> *pOVar6;
  Directory *pDVar7;
  PathPtr PVar8;
  StringPtr name;
  StringPtr local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  OwnOwn<const_kj::Directory> child;
  _Self local_70;
  StringPtr local_68;
  _Self local_58;
  iterator iter;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault local_30;
  Fault f;
  InMemoryDirectory *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  this_local = (InMemoryDirectory *)path.parts.ptr;
  f.exception = (Exception *)this;
  sVar3 = PathPtr::size((PathPtr *)&this_local);
  if (sVar3 == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x534,FAILED,(char *)0x0,"\"can\'t remove self from self\"",
               (char (*) [28])"can\'t remove self from self");
    path_local.parts.size_._7_1_ = 0;
    _::Debug::Fault::~Fault(&local_30);
  }
  else {
    sVar3 = PathPtr::size((PathPtr *)&this_local);
    if (sVar3 == 1) {
      MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&iter);
      pIVar4 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                         ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&iter);
      pSVar5 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr(&local_68,pSVar5);
      local_58._M_node =
           (_Base_ptr)
           std::
           map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
           ::find(&pIVar4->entries,&local_68);
      pIVar4 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                         ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&iter);
      local_70._M_node =
           (_Base_ptr)
           std::
           map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
           ::end(&pIVar4->entries);
      bVar1 = std::operator==(&local_58,&local_70);
      if (!bVar1) {
        pIVar4 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                           ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&iter);
        child.value.ptr =
             (Directory *)
             std::
             map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
             ::erase_abi_cxx11_((map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                                 *)&pIVar4->entries,(iterator)local_58._M_node);
        pIVar4 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                           ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&iter);
        Impl::modified(pIVar4);
      }
      path_local.parts.size_._7_1_ = !bVar1;
      Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&iter);
    }
    else {
      pSVar5 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr(&local_b8,pSVar5);
      name.content.size_ = (size_t)local_b8.content.ptr;
      name.content.ptr = (char *)this;
      tryGetParent((InMemoryDirectory *)local_a8,name,(WriteMode)local_b8.content.size_);
      _::readMaybe<kj::Directory_const>
                ((_ *)local_98,(Maybe<kj::Own<const_kj::Directory>_> *)local_a8);
      Maybe<kj::Own<const_kj::Directory>_>::~Maybe((Maybe<kj::Own<const_kj::Directory>_> *)local_a8)
      ;
      pOVar6 = _::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_98);
      if (pOVar6 == (Own<const_kj::Directory> *)0x0) {
        path_local.parts.size_._7_1_ = 0;
      }
      else {
        pOVar6 = _::OwnOwn<const_kj::Directory>::operator->((OwnOwn<const_kj::Directory> *)local_98)
        ;
        pDVar7 = Own<const_kj::Directory>::get(pOVar6);
        sVar3 = PathPtr::size((PathPtr *)&this_local);
        PVar8 = PathPtr::slice((PathPtr *)&this_local,1,sVar3);
        iVar2 = (*(pDVar7->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x16])
                          (pDVar7,PVar8.parts.ptr,PVar8.parts.size_);
        path_local.parts.size_._7_1_ = (byte)iVar2 & 1;
      }
      _::OwnOwn<const_kj::Directory>::~OwnOwn((OwnOwn<const_kj::Directory> *)local_98);
    }
  }
  return (bool)(path_local.parts.size_._7_1_ & 1);
}

Assistant:

bool tryRemove(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't remove self from self") { return false; }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      auto iter = lock->entries.find(path[0]);
      if (iter == lock->entries.end()) {
        return false;
      } else {
        lock->entries.erase(iter);
        lock->modified();
        return true;
      }
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], WriteMode::MODIFY)) {
        return child->get()->tryRemove(path.slice(1, path.size()));
      } else {
        return false;
      }
    }
  }